

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

int32_t intersect_uint16_cardinality(uint16_t *A,size_t lenA,uint16_t *B,size_t lenB)

{
  ushort *puVar1;
  ushort *puVar2;
  ushort uVar3;
  int32_t iVar4;
  
  iVar4 = 0;
  if (lenB != 0 && lenA != 0) {
    puVar1 = A + lenA;
    puVar2 = B + lenB;
    iVar4 = 0;
    do {
      while (uVar3 = *A, *B <= uVar3) {
        while (*B < uVar3) {
          B = B + 1;
          if (B == puVar2) {
            return iVar4;
          }
        }
        if (uVar3 != *B) break;
        iVar4 = iVar4 + 1;
        A = A + 1;
        if (A == puVar1) {
          return iVar4;
        }
        B = B + 1;
        if (B == puVar2) {
          return iVar4;
        }
      }
      A = A + 1;
    } while (A != puVar1);
  }
  return iVar4;
}

Assistant:

int32_t intersect_uint16_cardinality(const uint16_t *A, const size_t lenA,
                                     const uint16_t *B, const size_t lenB) {
    int32_t answer = 0;
    if (lenA == 0 || lenB == 0) return 0;
    const uint16_t *endA = A + lenA;
    const uint16_t *endB = B + lenB;

    while (1) {
        while (*A < *B) {
        SKIP_FIRST_COMPARE:
            if (++A == endA) return answer;
        }
        while (*A > *B) {
            if (++B == endB) return answer;
        }
        if (*A == *B) {
            ++answer;
            if (++A == endA || ++B == endB) return answer;
        } else {
            goto SKIP_FIRST_COMPARE;
        }
    }
    return answer;  // NOTREACHED
}